

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_args.c
# Opt level: O3

int mpt_object_args(mpt_object *obj,mpt_iterator *args)

{
  mpt_type_t mVar1;
  undefined8 *puVar2;
  int iVar3;
  mpt_value *pmVar4;
  char *pcVar5;
  int iVar6;
  ulong __n;
  char *prop;
  void *ptr;
  char name [256];
  char *local_170;
  undefined8 local_168;
  mpt_value mStack_160;
  char *pcStack_150;
  undefined8 local_148;
  undefined8 *local_140;
  char local_138 [264];
  
  mStack_160._type = 0;
  pcStack_150 = (char *)0x0;
  local_168 = 0;
  mStack_160._addr = (char **)0x0;
  local_148 = 0;
  pmVar4 = (*args->_vptr->value)(args);
  if (pmVar4 == (mpt_value *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    do {
      local_170 = (char *)0x0;
      mStack_160._type = 0;
      local_140 = (undefined8 *)pmVar4->_addr;
      mVar1 = pmVar4->_type;
      if (((mVar1 == 0x80) || (mVar1 == 0x801)) || (mVar1 - 0x100 < 0x700)) {
        puVar2 = (undefined8 *)*local_140;
        iVar3 = (**(code **)*puVar2)(puVar2,0x1a,&local_170);
        if ((iVar3 < 0) || (iVar3 = mpt_object_set_value(obj,local_170,&mStack_160), iVar3 < 0)) {
          mStack_160._type = 0;
          (**(code **)*puVar2)(puVar2,0x73,&local_170);
        }
      }
      if (mStack_160._type == 0) {
        if ((local_170 != (char *)0x0) ||
           (local_170 = mpt_data_tostring(&local_140,pmVar4->_type,(size_t *)0x0),
           local_170 != (char *)0x0)) {
          prop = local_170;
          pcVar5 = strchr(local_170,0x3d);
          mStack_160._type = 0x73;
          if (pcVar5 == (char *)0x0) {
            pcStack_150 = (char *)0x0;
            mStack_160._addr = &pcStack_150;
          }
          else {
            pcStack_150 = pcVar5 + 1;
            mStack_160._addr = &pcStack_150;
            __n = (long)pcVar5 - (long)prop;
            if (0xff < __n) {
              iVar3 = -0x11;
              goto LAB_0011703e;
            }
            memcpy(local_138,prop,__n);
            local_138[__n] = '\0';
            prop = local_138;
            local_170 = local_138;
          }
          iVar3 = mpt_object_set_value(obj,prop,&mStack_160);
          if (-1 < iVar3) goto LAB_00117000;
        }
        iVar3 = -2;
LAB_0011703e:
        if (iVar6 != 0) {
          return -iVar6;
        }
        return iVar3;
      }
LAB_00117000:
      iVar3 = (*args->_vptr->advance)(args);
      if (iVar3 < 1) {
        if (iVar6 == 0) {
          return 0;
        }
        return iVar3;
      }
      pmVar4 = (*args->_vptr->value)(args);
      iVar6 = iVar6 + -1;
    } while (pmVar4 != (mpt_value *)0x0);
    iVar6 = -iVar6;
  }
  return iVar6;
}

Assistant:

extern int mpt_object_args(MPT_INTERFACE(object) *obj, MPT_INTERFACE(iterator) *args)
{
	MPT_STRUCT(property) pr = MPT_PROPERTY_INIT;
	const MPT_STRUCT(value) *val;
	int count;
	
	count = 0;
	while ((val = args->_vptr->value(args))) {
		const void *ptr;
		int res;
		
		if (!val) {
			break;
		}
		pr.name = 0;
		pr.val._type = 0;
		ptr = val->_addr;
		if (MPT_type_isConvertable(val->_type)) {
			MPT_INTERFACE(convertable) *conv = *((void * const *) ptr);
			
			if (conv->_vptr->convert(conv, MPT_ENUM(TypeProperty), &pr) < 0
			 || mpt_object_set_value(obj, pr.name, &pr.val) < 0) {
				pr.val._type = 0;
				conv->_vptr->convert(conv, 's', &pr.name);
			}
		}
		/* value is not assigned via property */
		if (!pr.val._type) {
			char name[256];
			const char *str;
			if (!pr.name && !(pr.name = mpt_data_tostring(&ptr, val->_type, 0))) {
				return count ? count : MPT_ERROR(BadValue);
			}
			/* set non-assign options to default value */
			if (!(str = strchr(pr.name, '='))) {
				MPT_property_set_string(&pr, 0);
			} else {
				size_t len;
				MPT_property_set_string(&pr, str + 1);
				len = str - pr.name;
				if (len >= sizeof(name)) {
					return count ? count : MPT_ERROR(MissingBuffer);
				}
				pr.name = memcpy(name, pr.name, len);
				name[len++] = 0;
			}
			/* assign config */
			if (mpt_object_set_value(obj, pr.name, &pr.val) < 0) {
				return count ? count : MPT_ERROR(BadValue);
			}
		}
		if ((res = args->_vptr->advance(args)) <= 0) {
			return count ? res : count;
		}
		++count;
	}
	return count;
}